

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall helics::apps::Source::Source(Source *this,string_view name,string *configString)

{
  undefined8 *in_RDI;
  string *in_stack_00000198;
  App *in_stack_000001a0;
  undefined1 in_stack_000001a8 [16];
  Source *in_stack_00000450;
  undefined8 *t;
  Source *this_00;
  
  App::App(in_stack_000001a0,(string_view)in_stack_000001a8,in_stack_00000198);
  *in_RDI = &PTR__Source_00a473a8;
  CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::deque
            ((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
             0x407ee4);
  t = in_RDI + 0x1e;
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
            *)0x407efb);
  this_00 = (Source *)(in_RDI + 0x21);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x407f11);
  CLI::std::vector<helics::Endpoint,_std::allocator<helics::Endpoint>_>::vector
            ((vector<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x407f27);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x407f3d);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)this_00,(double)t);
  processArgs(in_stack_00000450);
  initialSetup(this_00);
  return;
}

Assistant:

Source::Source(std::string_view name, const std::string& configString): App(name, configString)
    {
        processArgs();
        initialSetup();
    }